

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

DigitalConsumer * __thiscall
AbstractModuleClient::subscribeDigitalData
          (AbstractModuleClient *this,size_t buffersize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channels)

{
  byte bVar1;
  bool bVar2;
  SubType SVar3;
  DigitalConsumer *this_00;
  undefined4 in_ESI;
  long in_RDI;
  HFSubSockSettings sockinfo;
  DigitalConsumer *newsub;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  DigitalConsumer *in_stack_fffffffffffffa60;
  hfs_data_callback_fn in_stack_fffffffffffffa68;
  allocator *paVar4;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  SubType type;
  HighFreqDataType *hf;
  HFSubSockSettings *this_01;
  HighFreqDataType *obj;
  HighFreqDataType *in_stack_fffffffffffffa90;
  undefined7 in_stack_fffffffffffffaa8;
  string *in_stack_fffffffffffffad8;
  string *in_stack_fffffffffffffae0;
  network_pimpl *in_stack_fffffffffffffae8;
  string *in_stack_fffffffffffffaf0;
  MlmWrap *in_stack_fffffffffffffaf8;
  HFParsingInfo *in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb54;
  HighFreqDataType *in_stack_fffffffffffffb58;
  DigitalConsumer *in_stack_fffffffffffffb60;
  MlmWrap *in_stack_fffffffffffffb68;
  string *in_stack_fffffffffffffb78;
  string *in_stack_fffffffffffffb80;
  MlmWrap *in_stack_fffffffffffffb88;
  string *in_stack_fffffffffffffc18;
  string *in_stack_fffffffffffffc20;
  MlmWrap *in_stack_fffffffffffffc28;
  string local_270 [88];
  string *in_stack_fffffffffffffde8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdf0;
  MlmWrap *in_stack_fffffffffffffdf8;
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [39];
  undefined1 local_1a9 [40];
  undefined1 local_181 [184];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [40];
  undefined4 local_18;
  DigitalConsumer *local_8;
  
  local_18 = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"digitalstream",&local_41);
  paVar4 = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Trodes",paVar4);
  bVar1 = MlmWrap::isHfTypeCurrentlySubbed
                    (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((bVar1 & 1) == 0) {
    this_01 = *(HFSubSockSettings **)(in_RDI + 0x28);
    obj = (HighFreqDataType *)local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_181 + 1),"digitalstream",(allocator *)obj);
    hf = (HighFreqDataType *)local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1a9 + 1),"Trodes",(allocator *)hf);
    network_pimpl::find_hfdt
              (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    std::__cxx11::string::~string((string *)(local_1a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1a9);
    std::__cxx11::string::~string((string *)(local_181 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_181);
    bVar2 = HighFreqDataType::isValid((HighFreqDataType *)in_stack_fffffffffffffa60);
    type = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa74);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)paVar4,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(bVar1,in_stack_fffffffffffffaa8));
      HighFreqDataType::getDataFormat_abi_cxx11_
                ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
      MlmWrap::createDigitalParsingInfo
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      std::__cxx11::string::~string(local_270);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(type,in_stack_fffffffffffffa70));
      this_00 = (DigitalConsumer *)operator_new(0x450);
      HighFreqDataType::HighFreqDataType(in_stack_fffffffffffffa90,obj);
      HFParsingInfo::HFParsingInfo((HFParsingInfo *)this_01,(HFParsingInfo *)hf);
      DigitalConsumer::DigitalConsumer
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb54,
                 in_stack_fffffffffffffb48);
      HFParsingInfo::~HFParsingInfo((HFParsingInfo *)this_00);
      HighFreqDataType::~HighFreqDataType((HighFreqDataType *)this_00);
      in_stack_fffffffffffffa60 = this_00;
      HighFreqDataType::HighFreqDataType(in_stack_fffffffffffffa90,obj);
      SVar3 = HighFreqSub::getSubSockType((HighFreqSub *)this_00);
      HFSubSockSettings::HFSubSockSettings
                (this_01,hf,type,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
      HighFreqDataType::~HighFreqDataType((HighFreqDataType *)in_stack_fffffffffffffa60);
      MlmWrap::addSubToList
                ((MlmWrap *)in_stack_fffffffffffffa60,(HighFreqSub *)CONCAT44(local_18,SVar3));
      HFSubSockSettings::HFSubSockSettings
                ((HFSubSockSettings *)in_stack_fffffffffffffa60,
                 (HFSubSockSettings *)CONCAT44(local_18,SVar3));
      MlmWrap::addHfTypeToSubbedList
                (in_stack_fffffffffffffb68,(HFSubSockSettings *)in_stack_fffffffffffffb60);
      HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x333b55);
      local_8 = this_00;
      HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x333b7d);
      HFParsingInfo::~HFParsingInfo((HFParsingInfo *)in_stack_fffffffffffffa60);
    }
    else {
      paVar4 = &local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1f0,"Digital data could not be found on the network!",paVar4);
      MlmWrap::error(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
      std::operator<<((ostream *)&std::cerr,local_1d0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string(local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      local_8 = (DigitalConsumer *)0x0;
    }
    HighFreqDataType::~HighFreqDataType((HighFreqDataType *)in_stack_fffffffffffffa60);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"digitalstream",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Trodes",&local_c9);
    local_8 = (DigitalConsumer *)
              MlmWrap::getHfSubObject
                        (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                         in_stack_fffffffffffffc18);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  return local_8;
}

Assistant:

DigitalConsumer* AbstractModuleClient::subscribeDigitalData(size_t buffersize, std::vector<std::string> channels){
    if(isHfTypeCurrentlySubbed(hfType_DIGITAL, TRODES_NETWORK_ID)){
        return (DigitalConsumer*)getHfSubObject(hfType_DIGITAL, TRODES_NETWORK_ID);
    }
    HighFreqDataType dt = state->find_hfdt(hfType_DIGITAL, TRODES_NETWORK_ID);
    if(!dt.isValid()){
        std::cerr << error("Digital data could not be found on the network!");
        return NULL;
    }
    HFParsingInfo parseinfo = createDigitalParsingInfo(channels, dt.getDataFormat());
    DigitalConsumer* newsub = new DigitalConsumer(dt, buffersize, parseinfo);
    HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
    addSubToList(newsub);
    addHfTypeToSubbedList(sockinfo);
    return newsub;
}